

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::GoniometricLight::PDF_Le(GoniometricLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  Float FVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  float fVar11;
  Point2f local_18;
  undefined1 extraout_var [60];
  
  *pdfPos = 0.0;
  fVar8 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar11 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar11),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar11),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar11),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar11 = auVar3._0_4_;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar4,auVar4);
  auVar3 = vfmadd231ss_fma(auVar3,auVar5,auVar5);
  auVar3 = vsqrtss_avx(auVar3,auVar3);
  fVar8 = auVar3._0_4_;
  auVar10._0_4_ = auVar5._0_4_ / fVar8;
  auVar10._4_12_ = auVar5._4_12_;
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar10);
  uVar1 = vcmpss_avx512f(auVar10,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  fVar6 = acosf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar3._0_4_));
  auVar9._0_4_ = atan2f(fVar11 / fVar8,auVar4._0_4_ / fVar8);
  auVar9._4_60_ = extraout_var;
  uVar1 = vcmpss_avx512f(auVar9._0_16_,ZEXT816(0) << 0x40,1);
  bVar2 = (bool)((byte)uVar1 & 1);
  local_18.super_Tuple2<pbrt::Point2,_float>.x =
       (float)((uint)bVar2 * (int)(auVar9._0_4_ + 6.2831855) + (uint)!bVar2 * (int)auVar9._0_4_);
  local_18.super_Tuple2<pbrt::Point2,_float>.y = fVar6;
  FVar7 = PiecewiseConstant2D::PDF(&this->distrib,&local_18);
  fVar8 = sinf(fVar6);
  *pdfDir = FVar7 / fVar8;
  return;
}

Assistant:

void GoniometricLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0.f;

    Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
    Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
    *pdfDir = distrib.PDF(Point2f(phi, theta)) / std::sin(theta);
}